

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmain.cpp
# Opt level: O0

int vm_get_game_type_for_file(char *filename)

{
  int iVar1;
  size_t sVar2;
  char *in_RDI;
  int ret;
  char buf [16];
  osfildef *fp;
  int local_2c;
  undefined1 local_28 [16];
  FILE *local_18;
  int local_4;
  
  local_18 = fopen(in_RDI,"rb");
  if (local_18 == (FILE *)0x0) {
    local_4 = -1;
  }
  else {
    sVar2 = fread(local_28,0x10,1,local_18);
    if (sVar2 == 1) {
      iVar1 = memcmp(local_28,"TADS2 bin\n\r\x1a",0xc);
      if (iVar1 == 0) {
        local_2c = 2;
      }
      else {
        iVar1 = memcmp(local_28,"T3-image\r\n\x1a",0xb);
        if (iVar1 == 0) {
          local_2c = 3;
        }
        else {
          local_2c = -2;
        }
      }
    }
    else {
      local_2c = -2;
    }
    fclose(local_18);
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

static int vm_get_game_type_for_file(const char *filename)
{
    osfildef *fp;
    char buf[16];
    int ret;
    
    /* try opening the filename exactly as given */
    fp = osfoprb(filename, OSFTBIN);

    /* if the file doesn't exist, tell the caller */
    if (fp == 0)
        return VM_GGT_NOT_FOUND;

    /* read the first few bytes of the file, where the signature resides */
    if (osfrb(fp, buf, 16))
    {
        /* 
         *   error reading the file - any valid game file is going to be at
         *   least long enough to hold the number of bytes we asked for, so
         *   it must not be a valid file 
         */
        ret = VM_GGT_INVALID;
    }
    else
    {
        /* check the signature we read against the known signatures */
        if (memcmp(buf, "TADS2 bin\012\015\032", 12) == 0)
            ret = VM_GGT_TADS2;
        else if (memcmp(buf, "T3-image\015\012\032", 11) == 0)
            ret = VM_GGT_TADS3;
        else
            ret = VM_GGT_INVALID;
    }

    /* close the file */
    osfcls(fp);

    /* return the version identifier */
    return ret;
}